

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O1

LogicalType *
duckdb::PrepareTypeForCastRecursive(LogicalType *__return_storage_ptr__,LogicalType *type)

{
  LogicalType *type_00;
  LogicalType LStack_28;
  
  if (type->id_ == LIST) {
    type_00 = ListType::GetChildType(type);
    PrepareTypeForCastRecursive(&LStack_28,type_00);
    LogicalType::LIST(__return_storage_ptr__,&LStack_28);
    LogicalType::~LogicalType(&LStack_28);
  }
  else if (type->id_ == ANY) {
    AnyType::GetTargetType(__return_storage_ptr__,type);
  }
  else {
    LogicalType::LogicalType(__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType PrepareTypeForCastRecursive(const LogicalType &type) {
	if (type.id() == LogicalTypeId::ANY) {
		return AnyType::GetTargetType(type);
	}
	if (type.id() == LogicalTypeId::LIST) {
		return LogicalType::LIST(PrepareTypeForCastRecursive(ListType::GetChildType(type)));
	}
	return type;
}